

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef expr,BinaryenExpressionRef timeoutExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef timeoutExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::AtomicWait>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<AtomicWait>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xc14,
                  "void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (timeoutExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)timeoutExpr;
    return;
  }
  __assert_fail("timeoutExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xc15,
                "void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef timeoutExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicWait>());
  assert(timeoutExpr);
  static_cast<AtomicWait*>(expression)->timeout = (Expression*)timeoutExpr;
}